

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O2

int kvtree_delete(kvtree **ptr_hash)

{
  kvtree *pkVar1;
  kvtree_elem_struct *pkVar2;
  kvtree_elem_struct **ppkVar3;
  kvtree_elem_struct *pkVar4;
  kvtree_elem *in_RAX;
  
  if ((ptr_hash != (kvtree **)0x0) && (pkVar1 = *ptr_hash, pkVar1 != (kvtree *)0x0)) {
    while (pkVar4 = pkVar1->lh_first, pkVar4 != (kvtree_elem_struct *)0x0) {
      pkVar2 = (pkVar4->pointers).le_next;
      ppkVar3 = (pkVar4->pointers).le_prev;
      if (pkVar2 != (kvtree_elem_struct *)0x0) {
        (pkVar2->pointers).le_prev = ppkVar3;
      }
      *ppkVar3 = pkVar2;
      kvtree_elem_delete(in_RAX);
    }
    kvtree_free(ptr_hash);
  }
  return 0;
}

Assistant:

int kvtree_delete(kvtree** ptr_hash)
{
  if (ptr_hash != NULL) {
    kvtree* hash = *ptr_hash;
    if (hash != NULL) {
      while (!LIST_EMPTY(hash)) {
        kvtree_elem* elem = LIST_FIRST(hash);
        LIST_REMOVE(elem, pointers);
        kvtree_elem_delete(elem);
      }
      kvtree_free(ptr_hash);
    }
  }
  return KVTREE_SUCCESS;
}